

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseMedia(Parser *this,MediaRule *mediaRule)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  Symbol *pSVar5;
  long lVar6;
  long in_FS_OFFSET;
  StyleRule rule;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    lVar1 = (this->symbols).d.size;
    iVar4 = this->index;
    lVar6 = (long)iVar4;
    lVar3 = lVar1 - lVar6;
    if (lVar3 != 0 && lVar6 <= lVar1) {
      pSVar5 = (this->symbols).d.ptr + lVar6;
      do {
        iVar4 = iVar4 + 1;
        if (pSVar5->token != S) break;
        this->index = iVar4;
        pSVar5 = pSVar5 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    iVar4 = this->index;
    if ((lVar1 <= iVar4) || ((this->symbols).d.ptr[iVar4].token != IDENT)) {
      this->errorIndex = iVar4;
      goto LAB_005ef4c3;
    }
    this->index = iVar4 + 1;
    parseMedium(this,&mediaRule->media);
    iVar4 = this->index;
    lVar1 = (this->symbols).d.size;
    if ((lVar1 <= iVar4) || ((this->symbols).d.ptr[iVar4].token != COMMA)) break;
    this->index = iVar4 + 1;
  } while( true );
  iVar4 = this->index;
  if ((iVar4 < lVar1) && (this->index = iVar4 + 1, (this->symbols).d.ptr[iVar4].token == LBRACE)) {
    iVar4 = this->index;
    lVar6 = (long)iVar4;
    lVar3 = lVar1 - lVar6;
    if (lVar3 != 0 && lVar6 <= lVar1) {
      pSVar5 = (this->symbols).d.ptr + lVar6;
      do {
        iVar4 = iVar4 + 1;
        if (pSVar5->token != S) break;
        this->index = iVar4;
        pSVar5 = pSVar5 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    bVar2 = testSimpleSelector(this);
    if (bVar2) {
      do {
        local_78.selectors.d.d = (Data *)0x0;
        local_78.selectors.d.ptr = (Selector *)0x0;
        local_78.selectors.d.size = 0;
        local_78.declarations.d.d = (Data *)0x0;
        local_78.declarations.d.ptr = (Declaration *)0x0;
        local_78.declarations.d.size = 0;
        local_78.order = 0;
        local_78._52_4_ = 0xaaaaaaaa;
        bVar2 = parseRuleset(this,&local_78);
        if (!bVar2) {
          QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
          QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                    ((QArrayDataPointer<QCss::Selector> *)&local_78);
          goto LAB_005ef4c3;
        }
        QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                  ((QMovableArrayOps<QCss::StyleRule> *)&mediaRule->styleRules,
                   (mediaRule->styleRules).d.size,&local_78);
        QList<QCss::StyleRule>::end(&mediaRule->styleRules);
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
        QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Selector> *)&local_78);
        bVar2 = testSimpleSelector(this);
      } while (bVar2);
    }
    iVar4 = this->index;
    lVar1 = (this->symbols).d.size;
    if ((iVar4 < lVar1) && (this->index = iVar4 + 1, (this->symbols).d.ptr[iVar4].token == RBRACE))
    {
      iVar4 = this->index;
      lVar6 = (long)iVar4;
      bVar2 = true;
      lVar3 = lVar1 - lVar6;
      if (lVar3 != 0 && lVar6 <= lVar1) {
        pSVar5 = (this->symbols).d.ptr + lVar6;
        do {
          iVar4 = iVar4 + 1;
          if (pSVar5->token != S) break;
          this->index = iVar4;
          pSVar5 = pSVar5 + 1;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      goto LAB_005ef4c5;
    }
  }
  this->errorIndex = this->index;
LAB_005ef4c3:
  bVar2 = false;
LAB_005ef4c5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Parser::parseMedia(MediaRule *mediaRule)
{
    do {
        skipSpace();
        if (!parseNextMedium(&mediaRule->media)) return false;
    } while (test(COMMA));

    if (!next(LBRACE)) return false;
    skipSpace();

    while (testRuleset()) {
        StyleRule rule;
        if (!parseRuleset(&rule)) return false;
        mediaRule->styleRules.append(rule);
    }

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}